

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O0

string * tinyusdz::unwrap(string *__return_storage_ptr__,string *str,string *delim)

{
  __type _Var1;
  ulong uVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_29;
  ulong local_28;
  size_t n;
  string *delim_local;
  string *str_local;
  string *s;
  
  n = (size_t)delim;
  delim_local = str;
  str_local = __return_storage_ptr__;
  local_28 = ::std::__cxx11::string::size();
  uVar2 = ::std::__cxx11::string::size();
  if (uVar2 < local_28) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)delim_local);
  }
  else {
    local_29 = 0;
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)delim_local);
    ::std::__cxx11::string::substr((ulong)&local_50,(ulong)__return_storage_ptr__);
    _Var1 = ::std::operator==(&local_50,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)n
                             );
    ::std::__cxx11::string::~string((string *)&local_50);
    if (_Var1) {
      ::std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
    }
    ::std::__cxx11::string::size();
    ::std::__cxx11::string::substr((ulong)&local_70,(ulong)__return_storage_ptr__);
    _Var1 = ::std::operator==(&local_70,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)n
                             );
    ::std::__cxx11::string::~string((string *)&local_70);
    if (_Var1) {
      lVar3 = ::std::__cxx11::string::size();
      ::std::__cxx11::string::erase((ulong)__return_storage_ptr__,lVar3 - local_28);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string unwrap(const std::string &str,
                          const std::string &delim = "\"") {
  size_t n = delim.size();

  if (str.size() < n) {
    return str;
  }

  std::string s = str;

  if (s.substr(0, n) == delim) {
    s.erase(0, n);
  }

  if (s.substr(s.size() - n) == delim) {
    s.erase(s.size() - n);
  }

  return s;
}